

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::internal::CmpHelperNear<int,double>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expr1,char *expr2,char *absc
          ,int *val1,int *val2,double *abs_v)

{
  int iVar1;
  AssertionResult *pAVar2;
  int diff;
  int local_84;
  char *local_80;
  char *local_78;
  internal *local_70;
  string local_68;
  AssertionResult local_48;
  
  iVar1 = *(int *)absc - *val1;
  local_84 = -iVar1;
  if (0 < iVar1) {
    local_84 = iVar1;
  }
  if (*(double *)val2 < (double)local_84) {
    local_48.m_message._M_dataplus._M_p = (pointer)&local_48.m_message.field_2;
    local_48.m_message._M_string_length = 0;
    local_48.m_message.field_2._M_local_buf[0] = '\0';
    local_48.m_result = false;
    local_80 = expr2;
    local_78 = expr1;
    local_70 = this;
    pAVar2 = AssertionResult::operator<<(&local_48,(char (*) [22])"error: Value of: abs(");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&local_70);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])" - ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_78);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [6])") <= ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_80);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [16])"\n  Actual: abs(");
    pAVar2 = AssertionResult::operator<<(pAVar2,(int *)absc);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])" - ");
    pAVar2 = AssertionResult::operator<<(pAVar2,val1);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])") : ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_84);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"\nExpected: ");
    PrintToString<double>(&local_68,(double *)val2);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_68);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNear(
    const char* expr1, const char* expr2, const char* absc
        , const T& val1, const T& val2, const A& abs_v)
{
    const T diff = val1 > val2 ? val1 - val2 : val2 - val1;
    if IUTEST_COND_LIKELY( diff <= abs_v )
    {
        return AssertionSuccess();
    }